

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLExtraDataLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::ExtraDataLoader::base__begin__technique
          (ExtraDataLoader *this,technique__AttributeData *attributeData,UniqueId *uniqueId,
          Object *object)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  bool calling;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t i;
  size_t index;
  StringHash elementHash;
  long lVar5;
  
  iVar4 = (*this->_vptr_ExtraDataLoader[2])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  lVar1 = *(long *)(lVar5 + 0x90);
  lVar2 = *(long *)(lVar5 + 0x88);
  for (index = 0; lVar1 - lVar2 >> 3 != index; index = index + 1) {
    plVar3 = *(long **)(*(long *)(lVar5 + 0x88) + index * 8);
    iVar4 = (*this->_vptr_ExtraDataLoader[2])(this);
    elementHash = FileLoader::getElementHash((FileLoader *)CONCAT44(extraout_var_00,iVar4),1);
    calling = (bool)(**(code **)(*plVar3 + 0x28))
                              (plVar3,attributeData->profile,&elementHash,uniqueId,object);
    ExtraDataElementHandler::setExtraDataCallbackHandlerCalling
              ((ExtraDataElementHandler *)(lVar5 + 0x80),index,calling);
  }
  return true;
}

Assistant:

bool ExtraDataLoader::base__begin__technique ( 
        const technique__AttributeData& attributeData, 
		const COLLADAFW::UniqueId& uniqueId,
		COLLADAFW::Object* object )
    {
        // Get the extra data element handler.
        ExtraDataElementHandler& extraDataElementHandler = getFileLoader ()->getExtraDataElementHandler ();

        // Ask all handlers, if they want to have the data of the current extra tag.
        // (profile name, element name ("optics"), id (cameraId)) 
        const ExtraDataCallbackHandlerList& extraDataCallbackHandlerList = extraDataElementHandler.getExtraDataCallbackHandlerList ();
        size_t numHandlers = extraDataCallbackHandlerList.size ();
        for ( size_t i=0; i<numHandlers; ++i )
        {
            IExtraDataCallbackHandler* extraDataCallbackHandler = extraDataCallbackHandlerList[i];

            // Get the hash value of the current element.
            size_t level = 1;
            StringHash elementHash = getFileLoader ()->getElementHash ( level );

            // Get the profile name.
            const ParserChar* profileName = attributeData.profile;

            // Ask, if the current handler should parse the extra tags of the current element.
            bool parseElement = extraDataCallbackHandler->parseElement ( profileName, elementHash, uniqueId, object );

            // Store the flag in the list.
            extraDataElementHandler.setExtraDataCallbackHandlerCalling ( i, parseElement );
        }
        return true;
    }